

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_solver.cpp
# Opt level: O2

void test_1(string *out_dir)

{
  ChStreamOutAscii *pCVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  double max_LCPerr;
  double max_res;
  ChSystemDescriptor mdescriptor;
  string filename;
  ChVariablesGeneric mvarA;
  DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_938 [24];
  Matrix<double,__1,__1,_1,__1,__1> local_920;
  ChVariablesGeneric mvarB;
  DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_8c8 [24];
  Matrix<double,__1,__1,_1,__1,__1> local_8b0;
  ChConstraintTwoGeneric mcb;
  double local_888;
  double local_880;
  ChConstraintTwoGeneric mca;
  double local_7f0;
  double local_7e8;
  ChSparseMatrix matrCq;
  ChSparseMatrix matrM;
  ChStreamOutAsciiFile fileM;
  ChStreamOutAscii local_3f0 [32];
  ChSolverPSOR solver;
  ChStreamOutAsciiFile fileCq;
  ChStreamOutAscii local_40 [32];
  
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar1,"\n-------------------------------------------------\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"TEST: generic system with two constraints \n\n");
  chrono::ChSystemDescriptor::ChSystemDescriptor(&mdescriptor);
  chrono::ChVariablesGeneric::ChVariablesGeneric(&mvarA,3);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_false>::run
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_938);
  _fileM = (XprTypeNested)0x4024000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::operator*=
            (local_938,(Scalar *)&fileM);
  _fileM = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::inverse
                     ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_938);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Inverse<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
            (&local_920,(Inverse<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&fileM);
  chrono::ChVariables::Get_fb((ChVectorRef *)&fileM,(ChVariables *)&mvarA);
  pSVar2 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&fileM,0);
  *pSVar2 = 1.0;
  chrono::ChVariables::Get_fb((ChVectorRef *)&fileM,(ChVariables *)&mvarA);
  pSVar2 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&fileM,1);
  *pSVar2 = 2.0;
  chrono::ChVariablesGeneric::ChVariablesGeneric(&mvarB,3);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_false>::run
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_8c8);
  _fileM = (XprTypeNested)0x4034000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::operator*=
            (local_8c8,(Scalar *)&fileM);
  _fileM = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::inverse
                     ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_8c8);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Inverse<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
            (&local_8b0,(Inverse<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&fileM);
  chrono::ChSystemDescriptor::InsertVariables(&mdescriptor,(ChVariables *)&mvarA);
  chrono::ChSystemDescriptor::InsertVariables(&mdescriptor,(ChVariables *)&mvarB);
  chrono::ChConstraintTwoGeneric::ChConstraintTwoGeneric
            (&mca,(ChVariables *)&mvarA,(ChVariables *)&mvarB);
  chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mca);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&fileM,0);
  *pSVar3 = 1.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mca);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&fileM,1);
  *pSVar3 = 2.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mca);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&fileM,2);
  *pSVar3 = -1.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&fileM,&mca);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&fileM,0);
  *pSVar3 = 1.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&fileM,&mca);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&fileM,1);
  *pSVar3 = -2.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&fileM,&mca);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&fileM,2);
  *pSVar3 = 0.0;
  chrono::ChConstraintTwoGeneric::ChConstraintTwoGeneric
            (&mcb,(ChVariables *)&mvarA,(ChVariables *)&mvarB);
  chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mcb);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&fileM,0);
  *pSVar3 = 0.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mcb);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&fileM,1);
  *pSVar3 = 1.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mcb);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&fileM,2);
  *pSVar3 = 0.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&fileM,&mcb);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&fileM,0);
  *pSVar3 = 0.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&fileM,&mcb);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&fileM,1);
  *pSVar3 = -2.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&fileM,&mcb);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&fileM,2);
  *pSVar3 = 0.0;
  chrono::ChSystemDescriptor::InsertConstraint(&mdescriptor,(ChConstraint *)&mca);
  chrono::ChSystemDescriptor::InsertConstraint(&mdescriptor,(ChConstraint *)&mcb);
  (**(code **)(_mdescriptor + 0x48))();
  chrono::ChSolverPSOR::ChSolverPSOR(&solver);
  chrono::ChIterativeSolverVI::SetOmega(0.8);
  chrono::ChSolverPSOR::Solve((ChSystemDescriptor *)&solver);
  chrono::ChSystemDescriptor::ComputeFeasabilityViolation((double *)&mdescriptor,&max_res);
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&matrM);
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&matrCq);
  chrono::ChSystemDescriptor::ConvertToMatrixForm
            ((SparseMatrix *)&mdescriptor,(SparseMatrix *)&matrCq,(SparseMatrix *)&matrM,
             (Matrix *)0x0,(Matrix *)0x0,(Matrix *)0x0,false,false);
  std::operator+(&filename,out_dir,"/dump_M_1.dat");
  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile(&fileM,filename._M_dataplus._M_p,_S_trunc);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileCq,
                 out_dir,"/dump_Cq_1.dat");
  std::__cxx11::string::operator=((string *)&filename,(string *)&fileCq);
  std::__cxx11::string::~string((string *)&fileCq);
  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile(&fileCq,filename._M_dataplus._M_p,_S_trunc);
  chrono::StreamOUTsparseMatlabFormat(&matrM,local_3f0);
  chrono::StreamOUTsparseMatlabFormat(&matrCq,local_40);
  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&fileCq);
  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&fileM);
  std::__cxx11::string::~string((string *)&filename);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::StreamOUT(&matrM,pCVar1);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::StreamOUT(&matrCq,pCVar1);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"**** Using ChSolverPSOR  ********** \n\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar1,"METRICS: max residual: ");
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,max_res);
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,"  max LCP error: ");
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,max_LCPerr);
  chrono::ChStreamOutAscii::operator<<(pCVar1,"  \n\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"vars q_a and q_b -------------------\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChVariables::Get_qb((ChVectorRef *)&fileM,(ChVariables *)&mvarA);
  chrono::operator<<(pCVar1,(Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>
                             *)&fileM);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChVariables::Get_qb((ChVectorRef *)&fileM,(ChVariables *)&mvarB);
  pCVar1 = chrono::operator<<(pCVar1,(Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>
                                      *)&fileM);
  chrono::ChStreamOutAscii::operator<<(pCVar1,"  \n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"multipliers l_1 and l_2 ------------\n\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,local_7e8);
  chrono::ChStreamOutAscii::operator<<(pCVar1," \n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,local_880);
  chrono::ChStreamOutAscii::operator<<(pCVar1," \n\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"constraint residuals c_1 and c_2 ---\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,local_7f0);
  chrono::ChStreamOutAscii::operator<<(pCVar1,"  \n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,local_888);
  chrono::ChStreamOutAscii::operator<<(pCVar1,"  \n\n\n");
  chrono::ChVariables::Get_qb((ChVectorRef *)&fileM,(ChVariables *)&mvarA);
  Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
  setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           *)&fileM);
  chrono::ChVariables::Get_qb((ChVectorRef *)&fileM,(ChVariables *)&mvarB);
  Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
  setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           *)&fileM);
  Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&matrCq);
  Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&matrM);
  chrono::ChIterativeSolverVI::~ChIterativeSolverVI((ChIterativeSolverVI *)&solver);
  chrono::ChConstraintTwoGeneric::~ChConstraintTwoGeneric(&mcb);
  chrono::ChConstraintTwoGeneric::~ChConstraintTwoGeneric(&mca);
  chrono::ChVariablesGeneric::~ChVariablesGeneric(&mvarB);
  chrono::ChVariablesGeneric::~ChVariablesGeneric(&mvarA);
  chrono::ChSystemDescriptor::~ChSystemDescriptor(&mdescriptor);
  return;
}

Assistant:

void test_1(const std::string& out_dir) {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: generic system with two constraints \n\n";

    // Important: create a 'system descriptor' object that
    // contains variables and constraints:

    ChSystemDescriptor mdescriptor;

    // Now let's add variables and constraints, as sparse data:

    mdescriptor.BeginInsertion();  // ----- system description starts here

    // create C++ objects representing 'variables':

    ChVariablesGeneric mvarA(3);
    mvarA.GetMass().setIdentity();
    mvarA.GetMass() *= 10;
    mvarA.GetInvMass() = mvarA.GetMass().inverse();
    mvarA.Get_fb()(0) = 1;
    mvarA.Get_fb()(1) = 2;

    ChVariablesGeneric mvarB(3);
    mvarB.GetMass().setIdentity();
    mvarB.GetMass() *= 20;
    mvarB.GetInvMass() = mvarB.GetMass().inverse();

    mdescriptor.InsertVariables(&mvarA);
    mdescriptor.InsertVariables(&mvarB);

    // create C++ objects representing 'constraints' between variables:

    ChConstraintTwoGeneric mca(&mvarA, &mvarB);
    mca.Set_b_i(-5);
    mca.Get_Cq_a()(0) = 1;
    mca.Get_Cq_a()(1) = 2;
    mca.Get_Cq_a()(2) = -1;
    mca.Get_Cq_b()(0) = 1;
    mca.Get_Cq_b()(1) = -2;
    mca.Get_Cq_b()(2) = 0;

    ChConstraintTwoGeneric mcb(&mvarA, &mvarB);
    mcb.Set_b_i(1);
    mcb.Get_Cq_a()(0) = 0;
    mcb.Get_Cq_a()(1) = 1;
    mcb.Get_Cq_a()(2) = 0;
    mcb.Get_Cq_b()(0) = 0;
    mcb.Get_Cq_b()(1) = -2;
    mcb.Get_Cq_b()(2) = 0;

    mdescriptor.InsertConstraint(&mca);
    mdescriptor.InsertConstraint(&mcb);

    mdescriptor.EndInsertion();  // ----- system description ends here

    // Solve the problem with an iterative fixed-point solver, for an
    // approximate (but very fast) solution:
    
    // Create the solver...
    ChSolverPSOR solver;
    solver.SetMaxIterations(1);
    solver.EnableWarmStart(false);
    solver.SetTolerance(0.0);
    solver.SetOmega(0.8);

    // .. pass the constraint and the variables to the solver to solve
    solver.Setup(mdescriptor);
    solver.Solve(mdescriptor);

    // Ok, now present the result to the user, with some
    // statistical information:
    double max_res, max_LCPerr;
    mdescriptor.ComputeFeasabilityViolation(max_res, max_LCPerr);

    // If needed, dump the full system M and Cq matrices
    // on disk, in Matlab sparse format:
    ChSparseMatrix matrM;
    ChSparseMatrix matrCq;

    mdescriptor.ConvertToMatrixForm(&matrCq, &matrM, 0, 0, 0, 0, false, false);

    try {
        std::string filename = out_dir + "/dump_M_1.dat";
        ChStreamOutAsciiFile fileM(filename.c_str());
        filename = out_dir + "/dump_Cq_1.dat";
        ChStreamOutAsciiFile fileCq(filename.c_str());
        StreamOUTsparseMatlabFormat(matrM, fileM);
        StreamOUTsparseMatlabFormat(matrCq, fileCq);
    } catch (const ChException &myex) {
        GetLog() << "FILE ERROR: " << myex.what();
    }

    StreamOUT(matrM, GetLog());
    StreamOUT(matrCq, GetLog());

    GetLog() << "**** Using ChSolverPSOR  ********** \n\n";
    GetLog() << "METRICS: max residual: " << max_res << "  max LCP error: " << max_LCPerr << "  \n\n";
    GetLog() << "vars q_a and q_b -------------------\n";
    GetLog() << mvarA.Get_qb();
    GetLog() << mvarB.Get_qb() << "  \n";
    GetLog() << "multipliers l_1 and l_2 ------------\n\n";
    GetLog() << mca.Get_l_i() << " \n";
    GetLog() << mcb.Get_l_i() << " \n\n";
    GetLog() << "constraint residuals c_1 and c_2 ---\n";
    GetLog() << mca.Get_c_i() << "  \n";
    GetLog() << mcb.Get_c_i() << "  \n\n\n";

    // reset variables
    mvarA.Get_qb().setZero();
    mvarB.Get_qb().setZero();
}